

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>
          (ArgBuilder *this,offset_in_ConfigData_to_bool field)

{
  Arg *pAVar1;
  IArgFunction<Catch::ConfigData> *pIVar2;
  undefined8 *puVar3;
  IArgFunction<Catch::ConfigData> *pIVar4;
  undefined **ppuVar5;
  
  puVar3 = (undefined8 *)operator_new(0x10);
  *puVar3 = &PTR__IArgFunction_00162858;
  puVar3[1] = field;
  pAVar1 = this->m_arg;
  pIVar4 = (IArgFunction<Catch::ConfigData> *)operator_new(0x10);
  ppuVar5 = &PTR__IArgFunction_00162858;
  pIVar4->_vptr_IArgFunction = (_func_int **)&PTR__IArgFunction_00162858;
  pIVar4[1]._vptr_IArgFunction = (_func_int **)field;
  pIVar2 = (pAVar1->super_CommonArgProperties<Catch::ConfigData>).boundField.functionObj;
  if (pIVar2 != (IArgFunction<Catch::ConfigData> *)0x0) {
    (*pIVar2->_vptr_IArgFunction[1])();
    ppuVar5 = (undefined **)*puVar3;
  }
  (pAVar1->super_CommonArgProperties<Catch::ConfigData>).boundField.functionObj = pIVar4;
  (*(code *)ppuVar5[1])(puVar3);
  return;
}

Assistant:

void bind( bool C::* field ) {
                m_arg->boundField = new Detail::BoundDataMember<C,bool>( field );
            }